

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

int Acb_NtkEcoPerform(Acb_Ntk_t *pNtkF,Acb_Ntk_t *pNtkG,char **pFileName,int fCisOnly,int fInputs,
                     int fCheck,int fVerbose,int fVeryVerbose)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  Acb_Ntk_t *pAVar4;
  char **ppcVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *pVVar8;
  Vec_Int_t *pVVar9;
  Vec_Int_t *vSupp_00;
  ulong uVar10;
  Vec_Int_t *vNodes;
  Gia_Man_t *pGVar11;
  Gia_Man_t *pGVar12;
  Gia_Man_t *p;
  Vec_Wec_t *vSupps;
  Cnf_Dat_t *pCVar13;
  sat_solver *s;
  abctime aVar14;
  abctime aVar15;
  Vec_Str_t *vPatchLine;
  Vec_Str_t *p_00;
  Gia_Man_t *p_01;
  int *piVar16;
  abctime time;
  abctime time_00;
  abctime time_01;
  int i;
  char *pcVar17;
  int *piVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  int local_fc;
  Vec_Ptr_t *local_f8;
  Vec_Ptr_t *local_e8;
  Vec_Int_t *vDivs;
  Vec_Int_t *local_d0;
  Acb_Ntk_t *local_c8;
  ulong local_c0;
  Gia_Man_t *local_b8;
  Gia_Man_t *local_b0;
  abctime local_a8;
  Vec_Ptr_t *local_a0;
  Vec_Int_t *vUsed;
  int Lit;
  Vec_Int_t *local_88;
  Vec_Str_t *vPatch;
  Vec_Str_t *vInst;
  Vec_Bit_t *local_70;
  char **local_68;
  Vec_Int_t *vNodesG;
  Vec_Int_t *vNodesF;
  Vec_Int_t *vSupp;
  Vec_Int_t *vSuppG;
  Vec_Int_t *vSuppF;
  Vec_Int_t *vRoots;
  
  local_68 = pFileName;
  local_a8 = Abc_Clock();
  local_88 = &pNtkF->vTargets;
  local_c0 = (ulong)(uint)(pNtkF->vTargets).nSize;
  pVVar7 = Acb_NtkFindRoots(pNtkF,local_88,&local_70);
  local_c8 = pNtkF;
  vRoots = pVVar7;
  pVVar8 = Acb_NtkFindSupp(pNtkF,pVVar7);
  vSuppF = pVVar8;
  pVVar9 = Acb_NtkFindSupp(pNtkG,pVVar7);
  vSuppG = pVVar9;
  vSupp_00 = Vec_IntAlloc(pVVar9->nSize + pVVar8->nSize);
  pAVar4 = local_c8;
  piVar3 = vSupp_00->pArray;
  piVar18 = pVVar8->pArray;
  piVar16 = pVVar9->pArray;
  piVar1 = piVar18 + pVVar8->nSize;
  piVar2 = piVar16 + pVVar9->nSize;
  uVar10 = 0;
  while ((piVar18 < piVar1 && (piVar16 < piVar2))) {
    iVar6 = *piVar18;
    iVar21 = *piVar16;
    if (iVar6 == iVar21) {
      piVar18 = piVar18 + 1;
      *(int *)((long)piVar3 + uVar10) = iVar6;
      piVar16 = piVar16 + 1;
    }
    else if (iVar6 < iVar21) {
      piVar18 = piVar18 + 1;
      *(int *)((long)piVar3 + uVar10) = iVar6;
    }
    else {
      piVar16 = piVar16 + 1;
      *(int *)((long)piVar3 + uVar10) = iVar21;
    }
    uVar10 = uVar10 + 4;
  }
  for (; piVar18 < piVar1; piVar18 = piVar18 + 1) {
    *(int *)((long)piVar3 + uVar10) = *piVar18;
    uVar10 = uVar10 + 4;
  }
  for (; piVar16 < piVar2; piVar16 = piVar16 + 1) {
    *(int *)((long)piVar3 + uVar10) = *piVar16;
    uVar10 = uVar10 + 4;
  }
  iVar6 = (int)(uVar10 >> 2);
  vSupp_00->nSize = iVar6;
  if (vSupp_00->nCap < iVar6) {
    __assert_fail("vArr->nSize <= vArr->nCap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x740,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (iVar6 < pVVar8->nSize) {
    __assert_fail("vArr->nSize >= vArr1->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x741,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (iVar6 < pVVar9->nSize) {
    __assert_fail("vArr->nSize >= vArr2->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x742,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  vSupp = vSupp_00;
  if (fInputs == 0 && fCisOnly == 0) {
    pVVar8 = Acb_NtkFindDivs(local_c8,vSupp_00,local_70,fVerbose);
  }
  else {
    pVVar8 = Acb_NtkFindDivsCis(local_c8,vSupp_00);
  }
  vDivs = pVVar8;
  pVVar9 = Acb_NtkFindNodes(pAVar4,pVVar7,pVVar8);
  vNodesF = pVVar9;
  vNodes = Acb_NtkFindNodes(pNtkG,pVVar7,(Vec_Int_t *)0x0);
  vNodesG = vNodes;
  pGVar11 = Acb_NtkToGia(pAVar4,vSupp_00,pVVar9,pVVar7,pVVar8,local_88);
  pGVar12 = Acb_NtkToGia(pNtkG,vSupp_00,vNodes,pVVar7,(Vec_Int_t *)0x0,(Vec_Int_t *)0x0);
  p = Acb_CreateMiter(pGVar11,pGVar12);
  uVar10 = local_c0;
  iVar21 = (int)local_c0;
  local_a0 = Vec_PtrAlloc(iVar21);
  vSupps = (Vec_Wec_t *)malloc(0x10);
  iVar6 = 8;
  if (6 < iVar21 - 1U) {
    iVar6 = iVar21;
  }
  pVVar7 = (Vec_Int_t *)0x0;
  vSupps->nSize = 0;
  vSupps->nCap = iVar6;
  if (iVar6 != 0) {
    pVVar7 = (Vec_Int_t *)calloc((long)iVar6,0x10);
  }
  vSupps->pArray = pVVar7;
  local_d0 = Vec_IntAlloc(100);
  vUsed = (Vec_Int_t *)0x0;
  if (fCisOnly == 0) {
    local_f8 = (Vec_Ptr_t *)0x0;
  }
  else {
    local_f8 = Vec_PtrAlloc(iVar21);
  }
  vInst = (Vec_Str_t *)0x0;
  vPatch = (Vec_Str_t *)0x0;
  if (fVerbose != 0) {
    printf("The number of targets = %d.\n");
    printf("NtkF:  ");
    Gia_ManPrintStats(pGVar11,(Gps_Par_t *)0x0);
    printf("NtkG:  ");
    Gia_ManPrintStats(pGVar12,(Gps_Par_t *)0x0);
    printf("Miter: ");
    Gia_ManPrintStats(p,(Gps_Par_t *)0x0);
  }
  if (fCheck != 0) {
    pCVar13 = Acb_NtkDeriveMiterCnf(p,iVar21,iVar21,fVerbose);
    local_e8 = (Vec_Ptr_t *)0x0;
    s = (sat_solver *)Cnf_DataWriteIntoSolver(pCVar13,1,0);
    Cnf_DataFree(pCVar13);
    Lit = 2;
    iVar6 = sat_solver_addclause(s,&Lit,(lit *)&local_88);
    if (iVar6 == 0) {
      sat_solver_delete(s);
      printf("The ECO problem has %s solution. ","a");
      aVar14 = Abc_Clock();
      Abc_PrintTime(0x82525c,(char *)(aVar14 - local_a8),time_00);
      uVar10 = local_c0;
    }
    else {
      iVar6 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
      sat_solver_delete(s);
      pcVar17 = "NO";
      if (iVar6 == -1) {
        pcVar17 = "a";
      }
      printf("The ECO problem has %s solution. ",pcVar17);
      aVar14 = Abc_Clock();
      Abc_PrintTime(0x82525c,(char *)(aVar14 - local_a8),time);
      uVar10 = local_c0;
      if (iVar6 != -1) {
        local_fc = 0;
        pVVar7 = local_d0;
        goto LAB_0032e978;
      }
    }
  }
  local_fc = 1;
  uVar20 = uVar10 & 0xffffffff;
  local_b8 = pGVar12;
  local_b0 = pGVar11;
  while (0 < (int)uVar20) {
    uVar19 = (int)uVar20 - 1;
    uVar20 = (ulong)uVar19;
    iVar6 = (int)uVar10;
    printf("\nConsidering target %d (out of %d)...\n",uVar20,uVar10 & 0xffffffff);
    if (fCisOnly == 0) {
      pCVar13 = Acb_NtkDeriveMiterCnf(p,uVar19,iVar6,fVerbose);
      pVVar7 = local_d0;
      iVar21 = vDivs->nSize;
      pVVar8 = Acb_DerivePatchSupport(pCVar13,uVar19,iVar6,iVar21,vDivs,local_c8,local_d0,0x78);
      if (pVVar8 == (Vec_Int_t *)0x0) {
        Cnf_DataFree(pCVar13);
        local_e8 = (Vec_Ptr_t *)0x0;
        local_fc = 0;
        pGVar12 = local_b8;
        pGVar11 = local_b0;
        goto LAB_0032e978;
      }
      Vec_IntAppend(pVVar7,pVVar8);
      pVVar8->nSize = 0;
      Vec_IntAppend(pVVar8,pVVar7);
      pcVar17 = Acb_DeriveOnePatchFunction(pCVar13,uVar19,iVar6,iVar21,pVVar8,0);
      Cnf_DataFree(pCVar13);
      if (pcVar17 == (char *)0x0) {
        local_e8 = (Vec_Ptr_t *)0x0;
        local_fc = 0;
        pGVar12 = local_b8;
        pVVar7 = local_d0;
        pGVar11 = local_b0;
        goto LAB_0032e978;
      }
      pGVar11 = Abc_SopSynthesizeOne(pcVar17,1);
      printf("Tar%02d: ");
      Gia_ManPrintStats(pGVar11,(Gps_Par_t *)0x0);
      pGVar12 = Acb_UpdateMiter(p,pGVar11,uVar19,iVar6,pVVar8,0);
      Gia_ManStop(p);
      Gia_ManStop(pGVar11);
      Vec_PtrPush(local_a0,pcVar17);
      if (fVeryVerbose != 0) {
        printf("Function %d\n%s",(ulong)uVar19,pcVar17);
      }
    }
    else {
      pVVar8 = Vec_IntStartNatural(vDivs->nSize);
      printf("Target %d has support with %d variables.\n",(ulong)uVar19,(ulong)(uint)pVVar8->nSize);
      pGVar11 = Acb_NtkDeriveMiterCnfInter(p,uVar19,iVar6);
      printf("Tar%02d: ");
      Gia_ManPrintStats(pGVar11,(Gps_Par_t *)0x0);
      pGVar12 = Acb_UpdateMiter(p,pGVar11,uVar19,iVar6,pVVar8,fCisOnly);
      Gia_ManStop(p);
      Vec_PtrPush(local_f8,pGVar11);
    }
    iVar6 = vSupps->nSize;
    if (iVar6 == vSupps->nCap) {
      uVar19 = iVar6 * 2;
      if (iVar6 < 0x10) {
        uVar19 = 0x10;
      }
      if (iVar6 < (int)uVar19) {
        if (vSupps->pArray == (Vec_Int_t *)0x0) {
          pVVar7 = (Vec_Int_t *)malloc((ulong)uVar19 << 4);
        }
        else {
          pVVar7 = (Vec_Int_t *)realloc(vSupps->pArray,(ulong)uVar19 << 4);
        }
        vSupps->pArray = pVVar7;
        memset(pVVar7 + iVar6,0,(long)(int)(uVar19 - iVar6) << 4);
        vSupps->nCap = uVar19;
      }
    }
    vSupps->nSize = iVar6 + 1U;
    if (iVar6 < 0) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                    ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
    }
    Vec_IntAppend(vSupps->pArray + ((ulong)(iVar6 + 1U) - 1),pVVar8);
    Vec_IntFree(pVVar8);
    uVar10 = local_c0;
    p = pGVar12;
  }
  putchar(10);
  pVVar7 = vDivs;
  if (fCisOnly == 0) {
    aVar14 = Abc_Clock();
    pCVar13 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,0,0,0);
    iVar6 = Acb_CheckMiter(pCVar13);
    Cnf_DataFree(pCVar13);
    pcVar17 = "The ECO solution was verified successfully.  ";
    if (iVar6 == 0) {
      pcVar17 = "The ECO solution verification FAILED.  ";
    }
    printf(pcVar17);
    aVar15 = Abc_Clock();
    Abc_PrintTime(0x82525c,(char *)(aVar15 - aVar14),time_01);
    pVVar7 = vDivs;
    local_e8 = Acb_TransformPatchFunctions(local_a0,vSupps,&vUsed,vDivs->nSize);
    Vec_PtrReverseOrder(local_e8);
    pVVar8 = vUsed;
  }
  else {
    pVVar8 = Vec_IntStartNatural(vDivs->nSize);
    vUsed = pVVar8;
    Vec_PtrReverseOrder(local_f8);
    local_e8 = (Vec_Ptr_t *)0x0;
  }
  pVVar9 = local_88;
  pAVar4 = local_c8;
  vPatchLine = Acb_GenerateInstance(local_c8,pVVar7,pVVar8,local_88);
  vInst = vPatchLine;
  p_00 = Acb_GeneratePatch(pAVar4,pVVar7,pVVar8,local_e8,local_f8,pVVar9);
  vPatch = p_00;
  Acb_PrintPatch(pAVar4,pVVar7,pVVar8,local_a8);
  ppcVar5 = local_68;
  pcVar17 = local_68[3];
  if (pcVar17 == (char *)0x0) {
    Acb_GenerateFilePatch(p_00,"patch.v");
    pcVar17 = ppcVar5[3];
  }
  if (pcVar17 == (char *)0x0) {
    pcVar17 = "out.v";
  }
  Acb_GenerateFileOut(vPatchLine,*ppcVar5,pcVar17,p_00);
  pcVar17 = ppcVar5[3];
  if (pcVar17 == (char *)0x0) {
    pcVar17 = "out.v";
  }
  printf("Finished dumping resulting file \"%s\".\n\n",pcVar17);
  pGVar12 = local_b8;
  pVVar7 = local_d0;
  pGVar11 = local_b0;
LAB_0032e978:
  if (local_f8 != (Vec_Ptr_t *)0x0) {
    for (iVar6 = 0; iVar6 < local_f8->nSize; iVar6 = iVar6 + 1) {
      p_01 = (Gia_Man_t *)Vec_PtrEntry(local_f8,iVar6);
      Gia_ManStop(p_01);
    }
    Vec_PtrFree(local_f8);
  }
  Vec_StrFreeP(&vPatch);
  Vec_StrFreeP(&vInst);
  Vec_PtrFreeFree(local_a0);
  Vec_WecFree(vSupps);
  Vec_IntFree(pVVar7);
  Vec_IntFreeP(&vUsed);
  if (local_e8 != (Vec_Ptr_t *)0x0) {
    Vec_PtrFreeFree(local_e8);
  }
  Gia_ManStop(pGVar11);
  Gia_ManStop(pGVar12);
  Gia_ManStop(p);
  Vec_IntFreeP(&vSuppF);
  Vec_IntFreeP(&vSuppG);
  Vec_IntFreeP(&vSupp);
  Vec_IntFreeP(&vNodesF);
  Vec_IntFreeP(&vNodesG);
  Vec_IntFreeP(&vRoots);
  Vec_IntFreeP(&vDivs);
  if (local_70 != (Vec_Bit_t *)0x0) {
    free(local_70->pArray);
    free(local_70);
  }
  return local_fc;
}

Assistant:

int Acb_NtkEcoPerform( Acb_Ntk_t * pNtkF, Acb_Ntk_t * pNtkG, char * pFileName[4], int fCisOnly, int fInputs, int fCheck, int fVerbose, int fVeryVerbose )
{
    extern Gia_Man_t * Abc_SopSynthesizeOne( char * pSop, int fClp );

    abctime clk  = Abc_Clock();
    int nTargets = Vec_IntSize(&pNtkF->vTargets);
    int TimeOut  = fCisOnly ? 0 : 120;  // 60 seconds
    int RetValue = 1;

    // compute various sets of nodes
    Vec_Bit_t * vBlock;
    Vec_Int_t * vRoots  = Acb_NtkFindRoots( pNtkF, &pNtkF->vTargets, &vBlock );
    Vec_Int_t * vSuppF  = Acb_NtkFindSupp( pNtkF, vRoots );
    Vec_Int_t * vSuppG  = Acb_NtkFindSupp( pNtkG, vRoots );
    Vec_Int_t * vSupp   = Vec_IntTwoMerge( vSuppF, vSuppG );
    Vec_Int_t * vDivs   = (fCisOnly || fInputs) ? Acb_NtkFindDivsCis( pNtkF, vSupp ) : Acb_NtkFindDivs( pNtkF, vSupp, vBlock, fVerbose );
    Vec_Int_t * vNodesF = Acb_NtkFindNodes( pNtkF, vRoots, vDivs );
    Vec_Int_t * vNodesG = Acb_NtkFindNodes( pNtkG, vRoots, NULL );

    // create AIGs
    Gia_Man_t * pGiaF   = Acb_NtkToGia( pNtkF, vSupp, vNodesF, vRoots, vDivs, &pNtkF->vTargets );
    Gia_Man_t * pGiaG   = Acb_NtkToGia( pNtkG, vSupp, vNodesG, vRoots, NULL, NULL );
    Gia_Man_t * pGiaM   = Acb_CreateMiter( pGiaF, pGiaG );

    Cnf_Dat_t * pCnf;
    Gia_Man_t * pTemp, * pOne;
    Vec_Ptr_t * vSops    = Vec_PtrAlloc( nTargets );
    Vec_Wec_t * vSupps   = Vec_WecAlloc( nTargets );
    Vec_Int_t * vSuppOld = Vec_IntAlloc( 100 );

    Vec_Int_t * vUsed  = NULL; 
    Vec_Ptr_t * vFuncs = NULL;
    Vec_Ptr_t * vGias  = fCisOnly ? Vec_PtrAlloc(nTargets) : NULL;
    Vec_Str_t * vInst  = NULL, * vPatch = NULL;

    char * pSop = NULL;
    int i;

    if ( fVerbose )
    {
        printf( "The number of targets = %d.\n", nTargets );

        printf( "NtkF:  " );
        Gia_ManPrintStats( pGiaF, NULL );
        printf( "NtkG:  " );
        Gia_ManPrintStats( pGiaG, NULL );
        printf( "Miter: " );
        Gia_ManPrintStats( pGiaM, NULL );
    }

    // check that the problem has a solution
    if ( fCheck )//fCisOnly )
    {
        int Lit, status;
        sat_solver * pSat;
        pCnf = Acb_NtkDeriveMiterCnf( pGiaM, nTargets, nTargets, fVerbose );
        pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
        Cnf_DataFree( pCnf );
        // add output clause
        Lit = Abc_Var2Lit( 1, 0 );
        status = sat_solver_addclause( pSat, &Lit, &Lit+1 );
        status = status == 0 ? l_False : sat_solver_solve( pSat, NULL, NULL, 0, 0, 0, 0 );
        sat_solver_delete( pSat );
        printf( "The ECO problem has %s solution. ", status == l_False ? "a" : "NO" );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        if ( status != l_False )
        {
            RetValue = 0;
            goto cleanup;
        }
    }

    for ( i = nTargets-1; i >= 0; i-- )
    {
        Vec_Int_t * vSupp = NULL;
        printf( "\nConsidering target %d (out of %d)...\n", i, nTargets );
        // compute support of this target
        if ( fCisOnly )
        {
            vSupp = Vec_IntStartNatural( Vec_IntSize(vDivs) );
            printf( "Target %d has support with %d variables.\n", i, Vec_IntSize(vSupp) );

            pOne = Acb_NtkDeriveMiterCnfInter( pGiaM, i, nTargets );
            printf( "Tar%02d: ", i );
            Gia_ManPrintStats( pOne, NULL );

            // update miter
            pGiaM = Acb_UpdateMiter( pTemp = pGiaM, pOne, i, nTargets, vSupp, fCisOnly );
            Gia_ManStop( pTemp );

            // add to functions
            Vec_PtrPush( vGias, pOne );
        }
        else
        {
            pCnf = Acb_NtkDeriveMiterCnf( pGiaM, i, nTargets, fVerbose );
//            vSupp = Acb_DerivePatchSupportS( pCnf, i, nTargets, Vec_IntSize(vDivs), vDivs, pNtkF, NULL, TimeOut );
            vSupp = Acb_DerivePatchSupport( pCnf, i, nTargets, Vec_IntSize(vDivs), vDivs, pNtkF, vSuppOld, TimeOut );
            if ( vSupp == NULL )
            {
                Cnf_DataFree( pCnf );
                RetValue = 0;
                goto cleanup;
            }
            Vec_IntAppend( vSuppOld, vSupp );
            Vec_IntClear( vSupp );
            Vec_IntAppend( vSupp, vSuppOld );
            //Vec_IntClear( vSuppOld );

            // derive function of this target
            pSop  = Acb_DeriveOnePatchFunction( pCnf, i, nTargets, Vec_IntSize(vDivs), vSupp, fCisOnly );
            Cnf_DataFree( pCnf );
            if ( pSop == NULL )
            {
                RetValue = 0;
                goto cleanup;
            }

            // add new function to the miter
            pOne  = Abc_SopSynthesizeOne( pSop, 1 );
            printf( "Tar%02d: ", i );
            Gia_ManPrintStats( pOne, NULL );

            // update miter
            pGiaM = Acb_UpdateMiter( pTemp = pGiaM, pOne, i, nTargets, vSupp, fCisOnly );
            Gia_ManStop( pTemp );
            Gia_ManStop( pOne );

            // add to functions
            Vec_PtrPush( vSops, pSop );
            if ( fVeryVerbose )
                printf( "Function %d\n%s", i, pSop );
        }
        // add to supports
        Vec_IntAppend( Vec_WecPushLevel(vSupps), vSupp );
        Vec_IntFree( vSupp );
    }

    // make sure the function is UNSAT
    printf( "\n" );
    if ( !fCisOnly )
    {
        int Res;
        abctime clk  = Abc_Clock();
        pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pGiaM, 8, 0, 0, 0, 0 );
        Res = Acb_CheckMiter( pCnf );
        Cnf_DataFree( pCnf );
        if ( Res == 1 )
            printf( "The ECO solution was verified successfully.  " );
        else
            printf( "The ECO solution verification FAILED.  " );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }

    // derive new patch functions
    if ( fCisOnly )
    {
        vUsed = Vec_IntStartNatural( Vec_IntSize(vDivs) );
        Vec_PtrReverseOrder( vGias );
    }
    else
    {
        vFuncs = Acb_TransformPatchFunctions( vSops, vSupps, &vUsed, Vec_IntSize(vDivs) );
        Vec_PtrReverseOrder( vFuncs );
    }

    // generate instance and patch
    vInst   = Acb_GenerateInstance( pNtkF, vDivs, vUsed, &pNtkF->vTargets );
    vPatch  = Acb_GeneratePatch( pNtkF, vDivs, vUsed, vFuncs, vGias, &pNtkF->vTargets );

    // print the results
    //printf( "%s", Vec_StrArray(vPatch) );
    Acb_PrintPatch( pNtkF, vDivs, vUsed, clk );

    // generate output files
    if ( pFileName[3] == NULL ) Acb_GenerateFilePatch( vPatch, "patch.v" );
    Acb_GenerateFileOut( vInst, pFileName[0], pFileName[3] ? pFileName[3] : (char *)"out.v", vPatch );
    printf( "Finished dumping resulting file \"%s\".\n\n", pFileName[3] ? pFileName[3] : "out.v" );
    //Gia_AigerWrite( pGiaG, "test.aig", 0, 0, 0 );
cleanup:
    // cleanup
    if ( vGias )
    {
        Gia_Man_t * pTemp; int i;
        Vec_PtrForEachEntry( Gia_Man_t *, vGias, pTemp, i )
            Gia_ManStop( pTemp );
        Vec_PtrFree( vGias );
    }
    Vec_StrFreeP( &vPatch );
    Vec_StrFreeP( &vInst );

    Vec_PtrFreeFree( vSops );
    Vec_WecFree( vSupps );
    Vec_IntFree( vSuppOld );
    Vec_IntFreeP( &vUsed );
    if ( vFuncs ) Vec_PtrFreeFree( vFuncs );

    Gia_ManStop( pGiaF );
    Gia_ManStop( pGiaG );
    Gia_ManStop( pGiaM );

    Vec_IntFreeP( &vSuppF );
    Vec_IntFreeP( &vSuppG );
    Vec_IntFreeP( &vSupp );
    Vec_IntFreeP( &vNodesF );
    Vec_IntFreeP( &vNodesG );
    Vec_IntFreeP( &vRoots );
    Vec_IntFreeP( &vDivs );
    Vec_BitFreeP( &vBlock );
    return RetValue;
}